

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

ngx_int_t ngx_copy_file(u_char *from,u_char *to,ngx_copy_file_t *cf)

{
  int iVar1;
  int iVar2;
  void *__buf;
  size_t sVar3;
  ngx_int_t nVar4;
  int *piVar5;
  char *pcVar6;
  int err;
  size_t size;
  ngx_log_t *pnVar7;
  ngx_uint_t level;
  u_char *puVar8;
  size_t sVar9;
  undefined1 local_d8 [8];
  ngx_file_info_t fi;
  
  iVar1 = open64((char *)from,0,0);
  if (iVar1 == -1) {
    pnVar7 = cf->log;
    nVar4 = -1;
    if (pnVar7->log_level < 3) {
      __buf = (void *)0x0;
      goto LAB_0011aa39;
    }
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    pcVar6 = "open() \"%s\" failed";
    __buf = (void *)0x0;
    level = 3;
  }
  else {
    sVar9 = cf->size;
    fi.__glibc_reserved[2] = (__syscall_slong_t)from;
    if ((cf->size == 0xffffffffffffffff) &&
       (iVar2 = fstat64(iVar1,(stat64 *)local_d8), sVar9 = fi.st_rdev, iVar2 == -1)) {
      pnVar7 = cf->log;
      nVar4 = -1;
      if (pnVar7->log_level < 2) {
        __buf = (void *)0x0;
      }
      else {
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        pcVar6 = "fstat() \"%s\" failed";
        __buf = (void *)0x0;
        to = (u_char *)fi.__glibc_reserved[2];
LAB_0011a9fc:
        ngx_log_error_core(2,pnVar7,iVar2,pcVar6,to);
      }
    }
    else {
      size = 0x10000;
      if (cf->buf_size != 0) {
        size = cf->buf_size;
      }
      if ((long)sVar9 <= (long)size) {
        size = sVar9;
      }
      __buf = ngx_alloc(size,cf->log);
      if (__buf == (void *)0x0) {
        __buf = (void *)0x0;
      }
      else {
        iVar2 = open64((char *)to,0x41,cf->access);
        if (iVar2 != -1) {
          for (; puVar8 = to, 0 < (long)sVar9; sVar9 = sVar9 - size) {
            if ((long)sVar9 <= (long)size) {
              size = sVar9;
            }
            sVar3 = read(iVar1,__buf,size);
            if (sVar3 == 0xffffffffffffffff) {
              pnVar7 = cf->log;
              nVar4 = -1;
              if (pnVar7->log_level < 2) goto LAB_0011a9cd;
              piVar5 = __errno_location();
              err = *piVar5;
              pcVar6 = "read() \"%s\" failed";
              puVar8 = (u_char *)fi.__glibc_reserved[2];
              goto LAB_0011a98e;
            }
            if (sVar3 != size) {
              pnVar7 = cf->log;
              if (1 < pnVar7->log_level) {
                pcVar6 = "read() has read only %z of %O from %s";
                puVar8 = (u_char *)fi.__glibc_reserved[2];
LAB_0011a9b3:
                ngx_log_error_core(2,pnVar7,0,pcVar6,sVar3,sVar9,puVar8);
              }
LAB_0011a9c5:
              nVar4 = -1;
              goto LAB_0011a9cd;
            }
            sVar3 = write(iVar2,__buf,size);
            if (sVar3 == 0xffffffffffffffff) {
              pnVar7 = cf->log;
              nVar4 = -1;
              if (pnVar7->log_level < 2) goto LAB_0011a9cd;
              piVar5 = __errno_location();
              err = *piVar5;
              pcVar6 = "write() \"%s\" failed";
              goto LAB_0011a98e;
            }
            if (sVar3 != size) {
              pnVar7 = cf->log;
              if (1 < pnVar7->log_level) {
                pcVar6 = "write() has written only %z of %O to %s";
                goto LAB_0011a9b3;
              }
              goto LAB_0011a9c5;
            }
          }
          if ((cf->time == -1) || (nVar4 = ngx_set_file_time(to,iVar2,cf->time), nVar4 == 0)) {
            nVar4 = 0;
          }
          else {
            pnVar7 = cf->log;
            nVar4 = -1;
            if (1 < pnVar7->log_level) {
              piVar5 = __errno_location();
              err = *piVar5;
              pcVar6 = "utimes() \"%s\" failed";
LAB_0011a98e:
              nVar4 = -1;
              ngx_log_error_core(2,pnVar7,err,pcVar6,puVar8);
            }
          }
LAB_0011a9cd:
          iVar2 = close(iVar2);
          if ((iVar2 == -1) && (pnVar7 = cf->log, 1 < pnVar7->log_level)) {
            piVar5 = __errno_location();
            iVar2 = *piVar5;
            pcVar6 = "close() \"%s\" failed";
            goto LAB_0011a9fc;
          }
          goto LAB_0011aa03;
        }
        pnVar7 = cf->log;
        if (2 < pnVar7->log_level) {
          piVar5 = __errno_location();
          ngx_log_error_core(3,pnVar7,*piVar5,"open() \"%s\" failed",to);
        }
      }
      nVar4 = -1;
    }
LAB_0011aa03:
    iVar1 = close(iVar1);
    if ((iVar1 != -1) || (pnVar7 = cf->log, pnVar7->log_level < 2)) goto LAB_0011aa39;
    piVar5 = __errno_location();
    iVar1 = *piVar5;
    pcVar6 = "close() \"%s\" failed";
    level = 2;
    from = (u_char *)fi.__glibc_reserved[2];
  }
  ngx_log_error_core(level,pnVar7,iVar1,pcVar6,from);
LAB_0011aa39:
  free(__buf);
  return nVar4;
}

Assistant:

ngx_int_t
ngx_copy_file(u_char *from, u_char *to, ngx_copy_file_t *cf)
{
    char             *buf;
    off_t             size;
    size_t            len;
    ssize_t           n;
    ngx_fd_t          fd, nfd;
    ngx_int_t         rc;
    ngx_file_info_t   fi;

    rc = NGX_ERROR;
    buf = NULL;
    nfd = NGX_INVALID_FILE;

    fd = ngx_open_file(from, NGX_FILE_RDONLY, NGX_FILE_OPEN, 0);

    if (fd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", from);
        goto failed;
    }

    if (cf->size != -1) {
        size = cf->size;

    } else {
        if (ngx_fd_info(fd, &fi) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_fd_info_n " \"%s\" failed", from);

            goto failed;
        }

        size = ngx_file_size(&fi);
    }

    len = cf->buf_size ? cf->buf_size : 65536;

    if ((off_t) len > size) {
        len = (size_t) size;
    }

    buf = ngx_alloc(len, cf->log);
    if (buf == NULL) {
        goto failed;
    }

    nfd = ngx_open_file(to, NGX_FILE_WRONLY, NGX_FILE_CREATE_OR_OPEN,
                        cf->access);

    if (nfd == NGX_INVALID_FILE) {
        ngx_log_error(NGX_LOG_CRIT, cf->log, ngx_errno,
                      ngx_open_file_n " \"%s\" failed", to);
        goto failed;
    }

    while (size > 0) {

        if ((off_t) len > size) {
            len = (size_t) size;
        }

        n = ngx_read_fd(fd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_read_fd_n " \"%s\" failed", from);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_read_fd_n " has read only %z of %O from %s",
                          n, size, from);
            goto failed;
        }

        n = ngx_write_fd(nfd, buf, len);

        if (n == -1) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_write_fd_n " \"%s\" failed", to);
            goto failed;
        }

        if ((size_t) n != len) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, 0,
                          ngx_write_fd_n " has written only %z of %O to %s",
                          n, size, to);
            goto failed;
        }

        size -= n;
    }

    if (cf->time != -1) {
        if (ngx_set_file_time(to, nfd, cf->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", to);
            goto failed;
        }
    }

    rc = NGX_OK;

failed:

    if (nfd != NGX_INVALID_FILE) {
        if (ngx_close_file(nfd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", to);
        }
    }

    if (fd != NGX_INVALID_FILE) {
        if (ngx_close_file(fd) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_ALERT, cf->log, ngx_errno,
                          ngx_close_file_n " \"%s\" failed", from);
        }
    }

    if (buf) {
        ngx_free(buf);
    }

    return rc;
}